

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

CPscl cp_decl_spec(CPState *cp,CPDecl *decl,CPscl scl)

{
  byte *pbVar1;
  GCstr *pGVar2;
  CTState *pCVar3;
  CType *pCVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar9;
  ulong uVar10;
  CTypeID CVar11;
  CTypeID CVar12;
  CTypeID CVar13;
  uint uVar14;
  CPDeclIdx CVar15;
  uint uVar16;
  ErrMsg em;
  ulong uVar17;
  CTInfo CVar18;
  CPToken tok;
  uint uVar19;
  CTInfo CVar20;
  uint uVar21;
  CPValue k;
  anon_union_4_2_43a9a9ed_for_CPValue_0 local_58;
  CTypeID CStack_54;
  uint local_50;
  CTypeID local_4c;
  CPDecl *local_48;
  ulong local_40;
  CType *local_38;
  
  decl->cp = cp;
  decl->mode = cp->mode;
  uVar17 = 0;
  decl->attr = 0;
  decl->fattr = 0;
  decl->top = 0;
  decl->pos = 0;
  decl->stack[0].next = 0;
  decl->name = (GCstr *)0x0;
  decl->redir = (GCstr *)0x0;
  uVar16 = 0;
  CVar12 = 0;
  local_50 = scl;
  local_48 = decl;
  do {
    cp_decl_attributes(cp,decl);
    tok = cp->tok;
    uVar10 = uVar17;
    CVar11 = CVar12;
    uVar21 = uVar16;
    CVar13 = local_4c;
    uVar8 = local_40;
    while (local_4c = CVar11, local_40 = uVar10, 0x13 < tok - 0x10dU) {
      bVar6 = uVar21 != 0;
      bVar7 = CVar12 != 0;
      if ((bVar6 || bVar7) || ((uVar17 & 0x7a0) != 0)) {
        CVar13 = local_4c;
        if (bVar6 || bVar7) {
          CVar13 = CVar12;
        }
        CVar12 = CVar13;
        uVar16 = 0;
        if (bVar6 || bVar7) {
          uVar16 = uVar21;
        }
        goto LAB_0013ad56;
      }
      uVar16 = 0;
      if (tok < 0x127) {
        if (tok == 0x24) {
          CVar12 = (cp->val).id;
        }
        else {
          if ((tok != 0x100) || (uVar21 = cp->ct->info, (uVar21 & 0xf0000000) != 0x70000000))
          goto LAB_0013ad56;
          CVar12 = uVar21 & 0xffff;
        }
        cp_next(cp);
      }
      else if (tok == 0x129) {
        CVar12 = cp_struct_name(cp,decl,0x50000001);
        if (cp->tok == 0x7b) {
          cp_next(cp);
          _local_58 = 0x900000000;
          CVar20 = 0x5002000a;
          CVar18 = 0x5002000a;
          CVar13 = CVar12;
          do {
            uVar17 = (ulong)CVar13;
            if (cp->tok != 0x100) {
              cp_err_token(cp,0x100);
            }
            pGVar2 = cp->str;
            if ((cp->val).id != 0) {
              cp_errmsg(cp,0,LJ_ERR_FFI_REDEF,pGVar2 + 1);
            }
            cp_next(cp);
            if (cp->tok == 0x3d) {
              cp_next(cp);
              cp_expr_kint(cp,(CPValue *)&local_58);
              if (CStack_54 == 10) {
                if (-1 < local_58.i32) {
                  _local_58 = CONCAT44(9,local_58.i32);
                }
              }
              else {
                _local_58 = CONCAT44(9,local_58.i32);
                CVar18 = CVar20;
                if (local_58.i32 < 0) {
                  CVar20 = 0x50020009;
                  CVar18 = 0x50020009;
                }
              }
            }
            CVar13 = lj_ctype_new(cp->cts,&local_38);
            pCVar3 = cp->cts;
            pCVar3->tab[uVar17].sib = (CTypeID1)CVar13;
            pGVar2->marked = pGVar2->marked | 0x20;
            uVar21 = (uint)pGVar2;
            (local_38->name).gcptr32 = uVar21;
            local_38->info = (CStack_54 | 0x2000000) + 0xb0000000;
            aVar9.i32 = local_58.i32;
            _local_58 = CONCAT44(CStack_54,local_58.i32 + 1);
            local_38->size = (CTSize)aVar9;
            uVar16 = uVar21 + 0xfb3ee249;
            uVar21 = (uVar21 ^ uVar16) - (uVar16 * 0x4000 | uVar16 >> 0x12);
            uVar16 = (uVar16 >> 0xd ^ uVar21) - (uVar21 >> 0x13) & 0x7f;
            local_38->next = pCVar3->hash[uVar16];
            pCVar3->hash[uVar16] = (CTypeID1)CVar13;
          } while ((cp->tok == 0x2c) && (cp_next(cp), cp->tok != 0x7d));
          cp_check(cp,0x7d);
          pCVar4 = cp->cts->tab;
          pCVar4[CVar12].info = CVar18;
          pCVar4[CVar12].size = 4;
          uVar17 = local_40;
          decl = local_48;
        }
      }
      else {
        if (tok == 0x128) {
          CVar18 = 0x10800000;
        }
        else {
          if (tok != 0x127) goto LAB_0013ad56;
          CVar18 = 0x10000000;
        }
        CVar12 = cp_decl_struct(cp,decl,CVar18);
      }
      cp_decl_attributes(cp,decl);
      uVar21 = 0;
      uVar10 = local_40;
      CVar11 = local_4c;
      CVar13 = local_4c;
      uVar8 = local_40;
      tok = cp->tok;
    }
    uVar19 = cp->ct->size;
    uVar16 = uVar21;
    local_4c = CVar13;
    local_40 = uVar8;
    if ((uVar19 == 0) || (uVar16 = uVar19, uVar21 == 0)) {
      uVar21 = 1 << ((byte)(tok - 0xdU) & 0x1f);
      uVar17 = (ulong)((uint)uVar17 | (uVar21 & (uint)uVar17) * 2 & 0x40 | 1 << (tok - 0xdU & 0x1f))
      ;
      if (tok < 0x11c) {
        if (CVar12 != 0) {
          bVar6 = false;
          goto LAB_0013ad37;
        }
      }
      else if ((local_50 & uVar21) == 0) {
        em = LJ_ERR_FFI_BADSCL;
        goto LAB_0013aec9;
      }
      cp_next(cp);
      bVar6 = true;
    }
    else {
      bVar6 = false;
      uVar16 = uVar21;
    }
LAB_0013ad37:
  } while (bVar6);
LAB_0013ad56:
  uVar21 = (uint)uVar17;
  CVar13 = (uVar16 != 4) + 0xf;
  if ((uVar21 >> 8 & 1) == 0) {
    CVar13 = CVar12;
  }
  if (CVar13 == 0) {
    if ((uVar17 & 1) == 0) {
      uVar14 = (uVar21 & 0x400) << 0xd;
      if ((uVar17 & 2) == 0) {
        if ((uVar17 & 0x10) == 0) {
          uVar19 = uVar16;
          if ((((uVar17 & 4) == 0) && (uVar19 = 2, -1 < (char)uVar17)) &&
             (uVar19 = 8, (uVar17 & 0x40) == 0)) {
            if ((uVar17 & 0x20) == 0) {
              uVar19 = uVar16;
              if ((uVar16 == 0) && (uVar19 = 4, (uVar17 & 0x600) == 0)) {
                tok = cp->tok;
                em = LJ_ERR_FFI_DECLSPEC;
                goto LAB_0013aec9;
              }
            }
            else {
              uVar14 = uVar14 | 0x400000;
            }
          }
        }
        else {
          uVar19 = 0x10;
          if ((uVar17 & 0x20) == 0) {
            uVar19 = uVar16;
          }
          uVar14 = 0x4000000;
        }
      }
      else {
        if ((uVar17 & 0xfff079f4) != 0) {
          tok = 0;
          em = LJ_ERR_FFI_INVTYPE;
LAB_0013aec9:
          cp_errmsg(cp,tok,em);
        }
        uVar14 = uVar14 | 0x8000000;
        if ((uVar21 >> 9 & 1) == 0) {
          uVar14 = 0x8800000;
        }
        uVar19 = uVar16 + (uVar16 == 0);
      }
      iVar5 = 0x1f;
      if (uVar19 != 0) {
        for (; uVar19 >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      CVar18 = (decl->attr & 0x3000000) + uVar14 + iVar5 * 0x10000;
    }
    else {
      CVar18 = decl->attr & 0x3000000 | 0x40000000;
      uVar19 = 0xffffffff;
    }
    CVar15 = cp_add(decl,CVar18,uVar19);
    decl->pos = CVar15;
    pbVar1 = (byte *)((long)&decl->attr + 3);
    *pbVar1 = *pbVar1 & 0xfc;
  }
  else {
    cp_push_type(decl,CVar13);
  }
  decl->specpos = decl->pos;
  decl->specattr = decl->attr;
  decl->specfattr = decl->fattr;
  return uVar21 & 0xf8000;
}

Assistant:

static CPscl cp_decl_spec(CPState *cp, CPDecl *decl, CPscl scl)
{
  uint32_t cds = 0, sz = 0;
  CTypeID tdef = 0;

  decl->cp = cp;
  decl->mode = cp->mode;
  decl->name = NULL;
  decl->redir = NULL;
  decl->attr = 0;
  decl->fattr = 0;
  decl->pos = decl->top = 0;
  decl->stack[0].next = 0;

  for (;;) {  /* Parse basic types. */
    cp_decl_attributes(cp, decl);
    if (cp->tok >= CTOK_FIRSTDECL && cp->tok <= CTOK_LASTDECLFLAG) {
      uint32_t cbit;
      if (cp->ct->size) {
	if (sz) goto end_decl;
	sz = cp->ct->size;
      }
      cbit = (1u << (cp->tok - CTOK_FIRSTDECL));
      cds = cds | cbit | ((cbit & cds & CDF_LONG) << 1);
      if (cp->tok >= CTOK_FIRSTSCL) {
	if (!(scl & cbit)) cp_errmsg(cp, cp->tok, LJ_ERR_FFI_BADSCL);
      } else if (tdef) {
	goto end_decl;
      }
      cp_next(cp);
      continue;
    }
    if (sz || tdef ||
	(cds & (CDF_SHORT|CDF_LONG|CDF_SIGNED|CDF_UNSIGNED|CDF_COMPLEX)))
      break;
    switch (cp->tok) {
    case CTOK_STRUCT:
      tdef = cp_decl_struct(cp, decl, CTINFO(CT_STRUCT, 0));
      continue;
    case CTOK_UNION:
      tdef = cp_decl_struct(cp, decl, CTINFO(CT_STRUCT, CTF_UNION));
      continue;
    case CTOK_ENUM:
      tdef = cp_decl_enum(cp, decl);
      continue;
    case CTOK_IDENT:
      if (ctype_istypedef(cp->ct->info)) {
	tdef = ctype_cid(cp->ct->info);  /* Get typedef. */
	cp_next(cp);
	continue;
      }
      break;
    case '$':
      tdef = cp->val.id;
      cp_next(cp);
      continue;
    default:
      break;
    }
    break;
  }
end_decl:

  if ((cds & CDF_COMPLEX))  /* Use predefined complex types. */
    tdef = sz == 4 ? CTID_COMPLEX_FLOAT : CTID_COMPLEX_DOUBLE;

  if (tdef) {
    cp_push_type(decl, tdef);
  } else if ((cds & CDF_VOID)) {
    cp_push(decl, CTINFO(CT_VOID, (decl->attr & CTF_QUAL)), CTSIZE_INVALID);
    decl->attr &= ~CTF_QUAL;
  } else {
    /* Determine type info and size. */
    CTInfo info = CTINFO(CT_NUM, (cds & CDF_UNSIGNED) ? CTF_UNSIGNED : 0);
    if ((cds & CDF_BOOL)) {
      if ((cds & ~(CDF_SCL|CDF_BOOL|CDF_INT|CDF_SIGNED|CDF_UNSIGNED)))
	cp_errmsg(cp, 0, LJ_ERR_FFI_INVTYPE);
      info |= CTF_BOOL;
      if (!(cds & CDF_SIGNED)) info |= CTF_UNSIGNED;
      if (!sz) {
	sz = 1;
      }
    } else if ((cds & CDF_FP)) {
      info = CTINFO(CT_NUM, CTF_FP);
      if ((cds & CDF_LONG)) sz = sizeof(long double);
    } else if ((cds & CDF_CHAR)) {
      if ((cds & (CDF_CHAR|CDF_SIGNED|CDF_UNSIGNED)) == CDF_CHAR)
	info |= CTF_UCHAR;  /* Handle platforms where char is unsigned. */
    } else if ((cds & CDF_SHORT)) {
      sz = sizeof(short);
    } else if ((cds & CDF_LONGLONG)) {
      sz = 8;
    } else if ((cds & CDF_LONG)) {
      info |= CTF_LONG;
      sz = sizeof(long);
    } else if (!sz) {
      if (!(cds & (CDF_SIGNED|CDF_UNSIGNED)))
	cp_errmsg(cp, cp->tok, LJ_ERR_FFI_DECLSPEC);
      sz = sizeof(int);
    }
    lua_assert(sz != 0);
    info += CTALIGN(lj_fls(sz));  /* Use natural alignment. */
    info += (decl->attr & CTF_QUAL);  /* Merge qualifiers. */
    cp_push(decl, info, sz);
    decl->attr &= ~CTF_QUAL;
  }
  decl->specpos = decl->pos;
  decl->specattr = decl->attr;
  decl->specfattr = decl->fattr;
  return (cds & CDF_SCL);  /* Return storage class. */
}